

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::push_clip
          (Fl_PostScript_Graphics_Driver *this,int x,int y,int w,int h)

{
  Clip *pCVar1;
  
  pCVar1 = (Clip *)operator_new(0x18);
  pCVar1->x = 0;
  pCVar1->y = 0;
  pCVar1->w = 0;
  pCVar1->h = 0;
  pCVar1->prev = (Clip *)0x0;
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2b])
            (this,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)h,pCVar1,&pCVar1->y,
             &pCVar1->w,&pCVar1->h);
  pCVar1->prev = this->clip_;
  this->clip_ = pCVar1;
  fwrite("CR\nCS\n",6,1,(FILE *)this->output);
  if (this->lang_level_ < 3) {
    recover(this);
  }
  pCVar1 = this->clip_;
  clocale_printf(this,"%g %g %i %i CL\n",SUB84((double)pCVar1->x + -0.5,0),(double)pCVar1->y + -0.5,
                 (ulong)(uint)pCVar1->w,(ulong)(uint)pCVar1->h);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::push_clip(int x, int y, int w, int h) {
  Clip * c=new Clip();
  clip_box(x,y,w,h,c->x,c->y,c->w,c->h);
  c->prev=clip_;
  clip_=c;
  fprintf(output, "CR\nCS\n");
  if(lang_level_<3)
    recover();
  clocale_printf("%g %g %i %i CL\n", clip_->x-0.5 , clip_->y-0.5 , clip_->w  , clip_->h);
  
}